

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3_174.c
# Opt level: O0

void OPL3_SlotGeneratePhase(opl3_slot_conflict *slot,Bit16u phase)

{
  ushort uVar1;
  int iVar2;
  uint local_1c;
  Bit8u phaseshift;
  Bit32u level;
  Bit32u neg;
  Bit16u phase_local;
  opl3_slot_conflict *slot_local;
  
  if ((phase & slot->maskzero) == 0) {
    iVar2 = (uint)phase << (slot->signpos & 0x1f);
    uVar1 = phase << (slot->phaseshift & 0x1f);
    if (slot->phaseshift < 2) {
      local_1c = (uint)logsinrom[(int)(uVar1 & 0x1ff)];
    }
    else {
      local_1c = (((uint)uVar1 ^ iVar2 >> 0x1f) & 0x3ff) * 8;
    }
    local_1c = local_1c + (int)slot->eg_out;
    slot->out = (ushort)((int)(uint)exprom[local_1c & 0xff] >> ((byte)(local_1c >> 8) & 0x1f)) ^
                (ushort)(iVar2 >> 0x1f);
  }
  else {
    slot->out = 0;
  }
  return;
}

Assistant:

static void OPL3_SlotGeneratePhase(opl3_slot *slot, Bit16u phase)
{
    Bit32u neg, level;
    Bit8u  phaseshift;

    /* Fast paths for mute segments */
    if (phase & slot->maskzero)
    {
        slot->out = 0;
        return;
    }

    neg = (Bit32s)((Bit32u)phase << slot->signpos) >> 31;
    phaseshift = slot->phaseshift;
    level = slot->eg_out;

    phase <<= phaseshift;
    if (phaseshift <= 1)
    {
        level += logsinrom[phase & 0x1ff];
    }
    else
    {
        level += ((phase ^ neg) & 0x3ff) << 3;
    }
    slot->out = exprom[level & 0xff] >> (level >> 8) ^ neg;
}